

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTupleMake(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  TupleMake *pTVar2;
  Iterator IVar3;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar4;
  Expression *local_78;
  uintptr_t *local_70;
  Type *t;
  Iterator __end1;
  undefined1 local_48 [8];
  Iterator __begin1;
  Type *__range1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> elements;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  elements.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  this_local = (TranslateToFuzzReader *)type.id;
  bVar1 = FeatureSet::hasMultivalue((FeatureSet *)(this->wasm + 0x178));
  if (!bVar1) {
    __assert_fail("wasm.features.hasMultivalue()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xaf3,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  bVar1 = Type::isTuple((Type *)&this_local);
  if (!bVar1) {
    __assert_fail("type.isTuple()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0xaf4,"Expression *wasm::TranslateToFuzzReader::makeTupleMake(Type)");
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)&this_local;
  IVar3 = Type::begin((Type *)__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index);
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
       (Type *)IVar3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  local_48 = (undefined1  [8])
             IVar3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
  PVar4 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
          Type::end((Type *)__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index);
  while( true ) {
    __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar4.index;
    t = PVar4.parent;
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_48,
                       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
    if (!bVar1) break;
    local_70 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_48);
    local_78 = make(this,(Type)*local_70);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1,
               &local_78);
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_48);
    PVar4.index = (size_t)__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar4.parent = t;
  }
  pTVar2 = Builder::makeTupleMake<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&__range1);
  return (Expression *)pTVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeTupleMake(Type type) {
  assert(wasm.features.hasMultivalue());
  assert(type.isTuple());
  std::vector<Expression*> elements;
  for (const auto& t : type) {
    elements.push_back(make(t));
  }
  return builder.makeTupleMake(std::move(elements));
}